

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise.cpp
# Opt level: O3

int ncnn::convolutiondepthwise
              (Mat *bottom_blob,Mat *top_blob,Mat *weight_data,Mat *bias_data,int kernel_w,
              int kernel_h,int stride_w,int stride_h,int dilation_w,int dilation_h,int group,
              int activation_type,Mat *activation_params,Option *opt)

{
  int *piVar1;
  size_t *psVar2;
  float fVar3;
  int iVar4;
  int iVar5;
  void *pvVar6;
  float *pfVar7;
  size_t sVar8;
  size_t sVar9;
  void *pvVar10;
  undefined1 auVar11 [16];
  uint uVar12;
  uint uVar13;
  int iVar14;
  uint uVar15;
  uint extraout_EAX;
  float *pfVar16;
  float *extraout_RAX;
  float *extraout_RAX_00;
  ulong uVar17;
  int iVar18;
  void *pvVar19;
  int iVar20;
  size_type __n;
  float *pfVar21;
  int iVar22;
  ulong uVar23;
  long lVar24;
  void *pvVar25;
  ulong uVar26;
  void *pvVar27;
  bool bVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  vector<int,_std::allocator<int>_> _space_ofs;
  float *local_150;
  void *local_140;
  void *local_138;
  allocator_type local_129;
  void *local_128;
  void *local_120;
  float *local_118;
  Mat *local_110;
  void *local_108;
  void *local_100;
  ulong local_f8;
  ulong local_f0;
  ulong local_e8;
  long local_e0;
  long local_d8;
  void *local_d0;
  int local_c4;
  void *local_c0;
  Mat *local_b8;
  long local_b0;
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  long local_80;
  void *local_78;
  ulong local_70;
  void *local_68;
  long local_60;
  long local_58;
  long local_50;
  vector<int,_std::allocator<int>_> local_48;
  
  local_f8 = (ulong)(uint)top_blob->w;
  if (bias_data->data == (void *)0x0) {
    bVar28 = true;
  }
  else {
    bVar28 = (long)bias_data->c * bias_data->cstep == 0;
  }
  local_100 = (void *)(ulong)(uint)top_blob->h;
  iVar14 = bottom_blob->w;
  iVar4 = bottom_blob->c;
  iVar5 = top_blob->c;
  uVar12 = kernel_h * kernel_w;
  __n = (size_type)(int)uVar12;
  local_110 = bottom_blob;
  local_b8 = bias_data;
  std::vector<int,_std::allocator<int>_>::vector(&local_48,__n,&local_129);
  auVar11 = local_a8;
  if (0 < kernel_h) {
    iVar18 = 0;
    iVar20 = 0;
    iVar22 = 0;
    do {
      if (0 < kernel_w) {
        lVar24 = 0;
        do {
          local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[iVar18 + lVar24] = iVar20;
          iVar20 = iVar20 + dilation_w;
          lVar24 = lVar24 + 1;
        } while (kernel_w != (int)lVar24);
        iVar18 = iVar18 + (int)lVar24;
      }
      iVar20 = iVar20 + (iVar14 * dilation_h - dilation_w * kernel_w);
      iVar22 = iVar22 + 1;
    } while (iVar22 != kernel_h);
  }
  lVar24 = (long)(int)local_f8;
  local_118 = (float *)(ulong)(uint)activation_type;
  local_b0 = lVar24;
  if (iVar5 == group && iVar4 == group) {
    uVar15 = activation_type;
    if (0 < group) {
      local_108 = top_blob->data;
      local_e0 = top_blob->cstep * top_blob->elemsize;
      pvVar19 = weight_data->data;
      piVar1 = &local_110->w;
      local_120 = local_110->data;
      psVar2 = &local_110->elemsize;
      local_110 = (Mat *)(local_110->cstep * *psVar2);
      pvVar25 = (void *)(long)stride_w;
      local_d8 = (long)stride_h * (long)*piVar1 * *psVar2;
      local_a8._4_4_ = 0;
      local_a8._0_4_ = group;
      local_a8._8_8_ = auVar11._8_8_;
      local_150 = (float *)0x0;
      pfVar16 = (float *)(ulong)(activation_type - 1);
      local_128 = pvVar25;
      local_118 = pfVar16;
      do {
        if (0 < (int)local_100) {
          local_d0 = (void *)((long)local_110 * (long)local_150 + (long)local_120);
          pvVar27 = (void *)(local_e0 * (long)local_150 + (long)local_108);
          local_140 = (void *)0x0;
          pfVar16 = local_150;
          pfVar21 = local_118;
          do {
            pvVar10 = local_d0;
            if (0 < (int)lVar24) {
              pvVar6 = local_b8->data;
              lVar24 = (long)local_140 * local_d8;
              pfVar7 = (float *)activation_params->data;
              uVar26 = 0;
              pfVar16 = pfVar7;
              do {
                fVar30 = 0.0;
                if (!bVar28) {
                  fVar30 = *(float *)((long)pvVar6 + (long)local_150 * 4);
                  pfVar16 = local_150;
                }
                if (0 < (int)uVar12) {
                  pfVar16 = (float *)((long)pvVar10 + uVar26 * (long)pvVar25 * 4 + lVar24);
                  uVar17 = 0;
                  do {
                    fVar30 = fVar30 + *(float *)((long)pvVar19 + uVar17 * 4) *
                                      pfVar16[local_48.super__Vector_base<int,_std::allocator<int>_>
                                              ._M_impl.super__Vector_impl_data._M_start[uVar17]];
                    uVar17 = uVar17 + 1;
                  } while (uVar12 != uVar17);
                }
                fVar31 = fVar30;
                if ((uint)pfVar21 < 6) {
                  pfVar16 = (float *)((long)&switchD_002728aa::switchdataD_00311d18 +
                                     (long)(int)(&switchD_002728aa::switchdataD_00311d18)
                                                [(long)pfVar21]);
                  switch(pfVar16) {
                  case (float *)0x2728ac:
                    if (fVar30 <= 0.0) {
                      fVar31 = 0.0;
                    }
                    break;
                  case (float *)0x2728b6:
                    local_98 = ZEXT416((uint)fVar30);
                    fVar30 = expf(fVar30);
                    fVar30 = logf(fVar30 + 1.0);
                    fVar30 = tanhf(fVar30);
                    pfVar16 = extraout_RAX;
                    pfVar21 = local_118;
                    pvVar25 = local_128;
                    fVar31 = fVar30 * (float)local_98._0_4_;
                    break;
                  case (float *)0x272901:
                    if (fVar30 <= *pfVar7) {
                      fVar30 = *pfVar7;
                    }
                    pfVar16 = pfVar7;
                    fVar31 = fVar30;
                    if (pfVar7[1] <= fVar30) {
                      fVar31 = pfVar7[1];
                    }
                    break;
                  case (float *)0x272917:
                    fVar30 = expf(-fVar30);
                    pfVar16 = extraout_RAX_00;
                    pfVar21 = local_118;
                    pvVar25 = local_128;
                    fVar31 = 1.0 / (fVar30 + 1.0);
                    break;
                  case (float *)0x272956:
                    pfVar16 = pfVar7;
                    fVar31 = (float)(~-(uint)(0.0 < fVar30) & (uint)*pfVar7 |
                                    -(uint)(0.0 < fVar30) & 0x3f800000) * fVar30;
                    break;
                  case (float *)0x272981:
                    fVar3 = *pfVar7;
                    fVar29 = -pfVar7[1] / fVar3;
                    pfVar16 = pfVar7;
                    fVar31 = 0.0;
                    if ((fVar29 <= fVar30) && (fVar31 = fVar30, fVar30 <= fVar29 + 1.0 / fVar3)) {
                      fVar31 = (fVar3 * fVar30 + pfVar7[1]) * fVar30;
                    }
                  }
                }
                *(float *)((long)pvVar27 + uVar26 * 4) = fVar31;
                uVar26 = uVar26 + 1;
              } while (uVar26 != local_f8);
            }
            pvVar27 = (void *)((long)pvVar27 + local_b0 * 4);
            local_140 = (void *)((long)local_140 + 1);
            lVar24 = local_b0;
          } while (local_140 != local_100);
        }
        uVar15 = (uint)pfVar16;
        local_150 = (float *)((long)local_150 + 1);
        pvVar19 = (void *)((long)pvVar19 + __n * 4);
      } while (local_150 != (float *)local_a8._0_8_);
    }
  }
  else {
    uVar13 = iVar4 / group;
    uVar15 = uVar13;
    if (0 < group) {
      uVar26 = (long)iVar5 / (long)group;
      local_c0 = (void *)(uVar26 & 0xffffffff);
      local_60 = top_blob->cstep * top_blob->elemsize;
      local_68 = top_blob->data;
      local_78 = weight_data->data;
      local_98._0_8_ = (long)stride_w;
      local_e0 = (long)stride_h;
      iVar14 = (int)uVar26;
      local_80 = (long)iVar14;
      local_70 = (ulong)(uint)group;
      local_c4 = iVar14 * uVar13 * uVar12;
      local_50 = (long)(int)(uVar13 * uVar12) << 2;
      local_e8 = 0;
      local_f0 = 0;
      do {
        if (0 < (int)local_c0) {
          local_128 = (void *)((long)local_78 + (long)(int)local_e8 * 4);
          local_58 = local_f0 * local_80;
          iVar14 = (int)local_f0;
          local_120 = (void *)0x0;
          do {
            if (0 < (int)local_100) {
              local_d8 = (long)local_120 + local_58;
              local_138 = (void *)(local_60 * local_d8 + (long)local_68);
              local_108 = (void *)0x0;
              do {
                if (0 < (int)local_f8) {
                  local_d0 = local_b8->data;
                  iVar4 = local_110->w;
                  sVar8 = local_110->elemsize;
                  sVar9 = local_110->cstep;
                  lVar24 = (long)local_108 * local_e0;
                  pvVar19 = local_110->data;
                  pfVar16 = (float *)activation_params->data;
                  uVar26 = 0;
                  do {
                    fVar30 = 0.0;
                    if (!bVar28) {
                      fVar30 = *(float *)((long)local_d0 + local_d8 * 4);
                    }
                    if (0 < (int)uVar13) {
                      uVar17 = 0;
                      pvVar25 = local_128;
                      do {
                        if (0 < (int)uVar12) {
                          uVar23 = 0;
                          do {
                            fVar30 = fVar30 + *(float *)((long)pvVar25 + uVar23 * 4) *
                                              *(float *)((long)pvVar19 +
                                                        (long)local_48.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start[uVar23] *
                                                  4 + (uVar17 + uVar13 * iVar14) * sVar9 * sVar8 +
                                                      uVar26 * local_98._0_8_ * 4 +
                                                      lVar24 * iVar4 * sVar8);
                            uVar23 = uVar23 + 1;
                          } while (uVar12 != uVar23);
                        }
                        uVar17 = uVar17 + 1;
                        pvVar25 = (void *)((long)pvVar25 + __n * 4);
                      } while (uVar17 != uVar13);
                    }
                    fVar31 = fVar30;
                    switch(activation_type) {
                    case 1:
                      if (fVar30 <= 0.0) {
                        fVar31 = 0.0;
                      }
                      break;
                    case 2:
                      fVar31 = (float)(~-(uint)(0.0 < fVar30) & (uint)*pfVar16 |
                                      -(uint)(0.0 < fVar30) & 0x3f800000) * fVar30;
                      break;
                    case 3:
                      if (fVar30 <= *pfVar16) {
                        fVar30 = *pfVar16;
                      }
                      fVar31 = fVar30;
                      if (pfVar16[1] <= fVar30) {
                        fVar31 = pfVar16[1];
                      }
                      break;
                    case 4:
                      fVar30 = expf(-fVar30);
                      fVar31 = 1.0 / (fVar30 + 1.0);
                      break;
                    case 5:
                      local_a8 = ZEXT416((uint)fVar30);
                      fVar30 = expf(fVar30);
                      fVar30 = logf(fVar30 + 1.0);
                      fVar30 = tanhf(fVar30);
                      fVar31 = fVar30 * (float)local_a8._0_4_;
                      break;
                    case 6:
                      fVar3 = *pfVar16;
                      fVar29 = -pfVar16[1] / fVar3;
                      fVar31 = 0.0;
                      if ((fVar29 <= fVar30) && (fVar31 = fVar30, fVar30 <= fVar29 + 1.0 / fVar3)) {
                        fVar31 = (fVar3 * fVar30 + pfVar16[1]) * fVar30;
                      }
                    }
                    *(float *)((long)local_138 + uVar26 * 4) = fVar31;
                    uVar26 = uVar26 + 1;
                  } while (uVar26 != local_f8);
                }
                local_138 = (void *)((long)local_138 + local_b0 * 4);
                local_108 = (void *)((long)local_108 + 1);
              } while (local_108 != local_100);
            }
            local_120 = (void *)((long)local_120 + 1);
            local_128 = (void *)((long)local_128 + local_50);
          } while (local_120 != local_c0);
        }
        local_f0 = local_f0 + 1;
        uVar15 = (int)local_e8 + local_c4;
        local_e8 = (ulong)uVar15;
      } while (local_f0 != local_70);
    }
  }
  if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
    uVar15 = extraout_EAX;
  }
  return uVar15;
}

Assistant:

static int convolutiondepthwise(const Mat& bottom_blob, Mat& top_blob, const Mat& weight_data, const Mat& bias_data, int kernel_w, int kernel_h, int stride_w, int stride_h, int dilation_w, int dilation_h, int group, int activation_type, const Mat& activation_params, const Option& opt)
{
    const int w = bottom_blob.w;
    const int inch = bottom_blob.c;

    const int outw = top_blob.w;
    const int outh = top_blob.h;
    const int outch = top_blob.c;

    const int bias_term = bias_data.empty() ? 0 : 1;

    const int maxk = kernel_w * kernel_h;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap = w * dilation_h - kernel_w * dilation_w;
        for (int i = 0; i < kernel_h; i++)
        {
            for (int j = 0; j < kernel_w; j++)
            {
                space_ofs[p1] = p2;
                p1++;
                p2 += dilation_w;
            }
            p2 += gap;
        }
    }

    // depth-wise
    if (inch == group && group == outch)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g = 0; g < group; g++)
        {
            float* outptr = top_blob.channel(g);
            const float* kptr = (const float*)weight_data + maxk * g;
            const Mat m = bottom_blob.channel(g);

            for (int i = 0; i < outh; i++)
            {
                for (int j = 0; j < outw; j++)
                {
                    float sum = 0.f;

                    if (bias_term)
                        sum = bias_data[g];

                    const float* sptr = m.row(i * stride_h) + j * stride_w;

                    for (int k = 0; k < maxk; k++)
                    {
                        float val = sptr[space_ofs[k]];
                        float w = kptr[k];
                        sum += val * w;
                    }

                    outptr[j] = activation_ss(sum, activation_type, activation_params);
                }

                outptr += outw;
            }
        }
    }
    else
    {
        // group convolution
        const int inch_g = inch / group;
        const int outch_g = outch / group;

#ifdef _WIN32
        #pragma omp parallel for num_threads(opt.num_threads)
#else
        #pragma omp parallel for collapse(2) num_threads(opt.num_threads)
#endif
        for (int g = 0; g < group; g++)
        {
            for (int p = 0; p < outch_g; p++)
            {
                float* outptr = top_blob.channel(g * outch_g + p);
                const float* weight_data_ptr = (const float*)weight_data + maxk * inch_g * outch_g * g;

#if NCNN_SIMPLEOMP
                // shadowed variable for less openmp task args
                const int outw = top_blob.w;
                const int outh = top_blob.h;
#endif

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        float sum = 0.f;

                        if (bias_term)
                            sum = bias_data[outch_g * g + p];

                        const float* kptr = weight_data_ptr + maxk * inch_g * p;

                        for (int q = 0; q < inch_g; q++)
                        {
                            const Mat m = bottom_blob.channel(inch_g * g + q);
                            const float* sptr = m.row(i * stride_h) + j * stride_w;

                            for (int k = 0; k < maxk; k++)
                            {
                                float val = sptr[space_ofs[k]];
                                float w = kptr[k];
                                sum += val * w;
                            }

                            kptr += maxk;
                        }

                        outptr[j] = activation_ss(sum, activation_type, activation_params);
                    }

                    outptr += outw;
                }
            }
        }
    }

    return 0;
}